

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_DEFI(Context *ctx)

{
  size_t in_RDX;
  char dst [64];
  char local_58 [72];
  
  get_ARB1_destarg_varname(ctx,local_58,in_RDX);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"PARAM %s = { %d, %d, %d, %d };",local_58,(ulong)ctx->dwords[0],
              (ulong)ctx->dwords[1],(ulong)ctx->dwords[2],ctx->dwords[3]);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_ARB1_DEFI(Context *ctx)
{
    char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    const int32 *x = (const int32 *) ctx->dwords;
    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s = { %d, %d, %d, %d };",
                dst, (int) x[0], (int) x[1], (int) x[2], (int) x[3]);
    pop_output(ctx);
}